

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key_tests.cpp
# Opt level: O3

void __thiscall key_tests::bip341_test_h::test_method(bip341_test_h *this)

{
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  const_string file;
  const_string msg;
  uint256 result;
  XOnlyPubKey H;
  HashWriter hw;
  array<std::byte,_65UL> G_uncompressed;
  char *local_160;
  char *local_158;
  assertion_result local_150;
  undefined1 *local_138;
  undefined1 *local_130;
  char *local_128;
  char *local_120;
  lazy_ostream local_118;
  undefined1 *local_108;
  char **ppcStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  CSHA256 local_d0;
  uchar local_61 [65];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  memcpy(local_61,&DAT_00ea73db,0x41);
  CSHA256::CSHA256(&local_d0);
  CSHA256::Write(&local_d0,local_61,0x41);
  local_108 = (undefined1 *)0x0;
  ppcStack_100 = (char **)0x0;
  local_118._vptr_lazy_ostream = (_func_int **)0x0;
  local_118._8_8_ = 0;
  CSHA256::Finalize(&local_d0,(uchar *)&local_118);
  local_e8 = local_108;
  uStack_e0 = ppcStack_100;
  local_f8 = local_118._vptr_lazy_ostream;
  uStack_f0 = local_118._8_8_;
  local_128 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/key_tests.cpp";
  local_120 = "";
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x16b;
  file.m_begin = (iterator)&local_128;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_138,msg);
  auVar2[0] = -((uchar)local_e8 == '\a');
  auVar2[1] = -(local_e8._1_1_ == 0x8a);
  auVar2[2] = -(local_e8._2_1_ == 'Z');
  auVar2[3] = -(local_e8._3_1_ == '\x0f');
  auVar2[4] = -(local_e8._4_1_ == '(');
  auVar2[5] = -(local_e8._5_1_ == 0xec);
  auVar2[6] = -(local_e8._6_1_ == 0x96);
  auVar2[7] = -(local_e8._7_1_ == 0xd5);
  auVar2[8] = -((uchar)uStack_e0 == 'G');
  auVar2[9] = -(uStack_e0._1_1_ == 0xbf);
  auVar2[10] = -(uStack_e0._2_1_ == 0xee);
  auVar2[0xb] = -(uStack_e0._3_1_ == 0x9a);
  auVar2[0xc] = -(uStack_e0._4_1_ == 0xce);
  auVar2[0xd] = -(uStack_e0._5_1_ == 0x80);
  auVar2[0xe] = -(uStack_e0._6_1_ == ':');
  auVar2[0xf] = -(uStack_e0._7_1_ == 0xc0);
  auVar1[0] = -((uchar)local_f8 == 'P');
  auVar1[1] = -(local_f8._1_1_ == 0x92);
  auVar1[2] = -(local_f8._2_1_ == 0x9b);
  auVar1[3] = -(local_f8._3_1_ == 't');
  auVar1[4] = -(local_f8._4_1_ == 0xc1);
  auVar1[5] = -(local_f8._5_1_ == 0xa0);
  auVar1[6] = -(local_f8._6_1_ == 'I');
  auVar1[7] = -(local_f8._7_1_ == 'T');
  auVar1[8] = -((uchar)uStack_f0 == 0xb7);
  auVar1[9] = -(uStack_f0._1_1_ == 0x8b);
  auVar1[10] = -(uStack_f0._2_1_ == 'K');
  auVar1[0xb] = -(uStack_f0._3_1_ == '`');
  auVar1[0xc] = -(uStack_f0._4_1_ == '5');
  auVar1[0xd] = -(uStack_f0._5_1_ == 0xe9);
  auVar1[0xe] = -(uStack_f0._6_1_ == 'z');
  auVar1[0xf] = -(uStack_f0._7_1_ == '^');
  auVar1 = auVar1 & auVar2;
  local_150.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       ((ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) | (ushort)(SUB161(auVar1 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar1 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar1 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar1 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar1 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar1 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar1 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar1 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar1 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar1 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar1 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar1 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar1 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar1 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar1[0xf] >> 7) << 0xf) == 0xffff);
  local_150.m_message.px = (element_type *)0x0;
  local_150.m_message.pn.pi_ = (sp_counted_base *)0x0;
  ppcStack_100 = &local_160;
  local_160 = "XOnlyPubKey::NUMS_H == H";
  local_158 = "";
  local_118._8_8_ = local_118._8_8_ & 0xffffffffffffff00;
  local_118._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_108 = boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (&local_150,&local_118,1,0,WARN,0xea55f4,(size_t)&stack0xfffffffffffffe90,0x16b);
  boost::detail::shared_count::~shared_count(&local_150.m_message.pn);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(bip341_test_h)
{
    constexpr auto G_uncompressed{"0479be667ef9dcbbac55a06295ce870b07029bfcdb2dce28d959f2815b16f81798483ada7726a3c4655da4fbfc0e1108a8fd17b448a68554199c47d08ffb10d4b8"_hex};
    HashWriter hw;
    hw.write(G_uncompressed);
    XOnlyPubKey H{hw.GetSHA256()};
    BOOST_CHECK(XOnlyPubKey::NUMS_H == H);
}